

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::add_curr_cell(rasterizer_cells_aa<agg::cell_aa> *this)

{
  cell_type *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
    if ((this->m_num_cells & 0xfff) == 0) {
      if (0x3ff < this->m_num_blocks) {
        return;
      }
      allocate_block(this);
    }
    pcVar1 = this->m_curr_cell_ptr;
    this->m_curr_cell_ptr = pcVar1 + 1;
    iVar2 = (this->m_curr_cell).y;
    iVar3 = (this->m_curr_cell).cover;
    iVar4 = (this->m_curr_cell).area;
    pcVar1->x = (this->m_curr_cell).x;
    pcVar1->y = iVar2;
    pcVar1->cover = iVar3;
    pcVar1->area = iVar4;
    this->m_num_cells = this->m_num_cells + 1;
  }
  return;
}

Assistant:

AGG_INLINE void rasterizer_cells_aa<Cell>::add_curr_cell()
    {
        if(m_curr_cell.area | m_curr_cell.cover)
        {
            if((m_num_cells & cell_block_mask) == 0)
            {
                if(m_num_blocks >= cell_block_limit) return;
                allocate_block();
            }
            *m_curr_cell_ptr++ = m_curr_cell;
            ++m_num_cells;
        }
    }